

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlFreeIDCHashEntry(void *payload,xmlChar *name)

{
  long *plVar1;
  xmlIDCHashEntryPtr_conflict e;
  
  if (payload != (void *)0x0) {
    do {
      plVar1 = *payload;
      (*xmlFree)(payload);
      payload = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return;
}

Assistant:

static void
xmlFreeIDCHashEntry (void *payload, const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlIDCHashEntryPtr e = payload, n;
    while (e) {
	n = e->next;
	xmlFree(e);
	e = n;
    }
}